

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_implicit_global_from_local(REF_NODE ref_node)

{
  REF_MPI ref_mpi;
  uint uVar1;
  void *array;
  REF_GLOB *vector;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  REF_STATUS RVar8;
  char *pcVar9;
  long lVar10;
  REF_GLOB nnode;
  
  ref_mpi = ref_node->ref_mpi;
  uVar1 = ref_node_synchronize_globals(ref_node);
  if (uVar1 == 0) {
    nnode = 0;
    uVar4 = 0;
    uVar3 = (ulong)(uint)ref_node->max;
    if (ref_node->max < 1) {
      uVar3 = uVar4;
    }
    lVar7 = 0;
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      if ((-1 < ref_node->global[uVar4]) && (ref_node->ref_mpi->id == ref_node->part[uVar4])) {
        lVar7 = lVar7 + 1;
        nnode = lVar7;
      }
    }
    if ((long)ref_mpi->n < 0) {
      pcVar9 = "malloc everyones_nnode of REF_GLOB negative";
      uVar6 = 0x311;
    }
    else {
      array = malloc((long)ref_mpi->n << 3);
      if (array == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x311,"ref_node_implicit_global_from_local","malloc everyones_nnode of REF_GLOB NULL"
              );
        return 2;
      }
      uVar1 = ref_mpi_allgather(ref_mpi,&nnode,array,2);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x313,"ref_node_implicit_global_from_local",(ulong)uVar1,"allgather");
        return uVar1;
      }
      uVar4 = 0;
      uVar3 = (ulong)(uint)ref_mpi->id;
      if (ref_mpi->id < 1) {
        uVar3 = uVar4;
      }
      lVar7 = 0;
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        lVar7 = lVar7 + *(long *)((long)array + uVar4 * 8);
      }
      free(array);
      lVar10 = (long)ref_node->max;
      if (-1 < lVar10) {
        vector = (REF_GLOB *)malloc(lVar10 * 8);
        if (vector == (REF_GLOB *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x31a,"ref_node_implicit_global_from_local","malloc global of REF_GLOB NULL");
          return 2;
        }
        nnode = 0;
        lVar5 = 0;
        for (lVar2 = 0; lVar10 != lVar2; lVar2 = lVar2 + 1) {
          if ((-1 < ref_node->global[lVar2]) && (ref_node->ref_mpi->id == ref_node->part[lVar2])) {
            vector[lVar2] = lVar5 + lVar7;
            lVar5 = lVar5 + 1;
            nnode = lVar5;
          }
        }
        uVar1 = ref_node_ghost_glob(ref_node,vector,1);
        if (uVar1 == 0) {
          uVar4 = 0;
          uVar3 = (ulong)(uint)ref_node->max;
          if (ref_node->max < 1) {
            uVar3 = uVar4;
          }
          for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
            if (-1 < ref_node->global[uVar4]) {
              ref_node->global[uVar4] = vector[uVar4];
            }
          }
          free(vector);
          uVar1 = ref_node_rebuild_sorted_global(ref_node);
          if (uVar1 == 0) {
            return 0;
          }
          uVar3 = (ulong)uVar1;
          pcVar9 = "rebuild globals";
          uVar6 = 0x32c;
        }
        else {
          uVar3 = (ulong)uVar1;
          pcVar9 = "ghost int";
          uVar6 = 0x324;
        }
        goto LAB_00127ece;
      }
      pcVar9 = "malloc global of REF_GLOB negative";
      uVar6 = 0x31a;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
           "ref_node_implicit_global_from_local",pcVar9);
    RVar8 = 1;
  }
  else {
    uVar3 = (ulong)uVar1;
    pcVar9 = "sync";
    uVar6 = 0x308;
LAB_00127ece:
    RVar8 = (REF_STATUS)uVar3;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
           "ref_node_implicit_global_from_local",uVar3,pcVar9);
  }
  return RVar8;
}

Assistant:

REF_FCN REF_STATUS ref_node_implicit_global_from_local(REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT node, proc;
  REF_GLOB nnode, *global;
  REF_GLOB *everyones_nnode, offset;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nnode++;
    }
  }

  ref_malloc(everyones_nnode, ref_mpi_n(ref_mpi), REF_GLOB);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, everyones_nnode, REF_GLOB_TYPE),
      "allgather");

  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++)
    offset += everyones_nnode[proc];

  ref_free(everyones_nnode);
  ref_malloc(global, ref_node_max(ref_node), REF_GLOB);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      global[node] = offset + nnode;
      nnode++;
    }
  }

  RSS(ref_node_ghost_glob(ref_node, global, 1), "ghost int");

  each_ref_node_valid_node(ref_node, node) {
    ref_node->global[node] = global[node];
  }

  ref_free(global);

  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild globals");

  return REF_SUCCESS;
}